

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k_ary_search_set.hpp
# Opt level: O1

void __thiscall
burst::k_ary_search_set<int,std::less<void>>::initialize<boost::iterator_range<int_const*>>
          (k_ary_search_set<int,std::less<void>> *this,iterator_range<const_int_*> *range)

{
  int iVar1;
  int *piVar2;
  int *piVar3;
  long lVar4;
  int *piVar5;
  ulong uVar6;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var7;
  int *piVar8;
  int *piVar9;
  value_container_type buffer;
  int *local_40;
  int *local_38;
  long local_30;
  iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
  local_28;
  
  piVar2 = (range->
           super_iterator_range_base<const_int_*,_boost::iterators::random_access_traversal_tag>).
           super_iterator_range_base<const_int_*,_boost::iterators::bidirectional_traversal_tag>.
           super_iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>.
           m_Begin;
  piVar3 = (range->
           super_iterator_range_base<const_int_*,_boost::iterators::random_access_traversal_tag>).
           super_iterator_range_base<const_int_*,_boost::iterators::bidirectional_traversal_tag>.
           super_iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>.
           m_End;
  piVar8 = piVar3;
  piVar5 = piVar2;
  if (piVar2 != piVar3) {
    do {
      piVar9 = piVar5 + 1;
      piVar8 = piVar3;
      if (piVar9 == piVar3) break;
      iVar1 = *piVar5;
      piVar8 = piVar5;
      piVar5 = piVar9;
    } while (iVar1 < *piVar9);
  }
  if (piVar8 == piVar3) {
    initialize_trusted<boost::iterator_range<int_const*>>(this,range);
    return;
  }
  std::vector<int,std::allocator<int>>::vector<int_const*,void>
            ((vector<int,std::allocator<int>> *)&local_40,piVar2,piVar3,(allocator_type *)&local_28)
  ;
  piVar3 = local_38;
  piVar2 = local_40;
  if (local_40 != local_38) {
    uVar6 = (long)local_38 - (long)local_40 >> 2;
    lVar4 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar6 >> lVar4 == 0; lVar4 = lVar4 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<std::less<void>>>
              (local_40,local_38,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::less<void>>>
              (piVar2,piVar3);
  }
  _Var7 = std::
          __unique<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<burst::not_fn_t<std::less<void>>>>
                    (local_40,local_38);
  if ((_Var7._M_current != local_38) && (local_38 != _Var7._M_current)) {
    local_38 = _Var7._M_current;
  }
  local_28.
  super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::random_access_traversal_tag>
  .
  super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::bidirectional_traversal_tag>
  .
  super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::incrementable_traversal_tag>
  .m_Begin._M_current = local_40;
  local_28.
  super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::random_access_traversal_tag>
  .
  super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::bidirectional_traversal_tag>
  .
  super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::incrementable_traversal_tag>
  .m_End._M_current = local_38;
  initialize_trusted<boost::iterator_range<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>>
            (this,&local_28);
  if (local_40 != (int *)0x0) {
    operator_delete(local_40,local_30 - (long)local_40);
  }
  return;
}

Assistant:

void initialize (const RandomAccessRange & range)
        {
            const auto is_sorted_and_unique =
                std::adjacent_find(range.begin(), range.end(), burst::not_fn(m_compare)) == range.end();
            if (is_sorted_and_unique)
            {
                initialize_trusted(range);
            }
            else
            {
                value_container_type buffer(range.begin(), range.end());
                std::sort(buffer.begin(), buffer.end(), m_compare);
                buffer.erase
                (
                    std::unique(buffer.begin(), buffer.end(), burst::not_fn(m_compare)),
                    buffer.end()
                );

                initialize_trusted(boost::make_iterator_range(buffer));
            }
        }